

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O3

void __thiscall
pktalloc::CustomBitSet<2048U>::SetRange(CustomBitSet<2048U> *this,uint bitStart,uint bitEnd)

{
  uint uVar1;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar2;
  
  if (bitStart < bitEnd) {
    uVar4 = bitEnd >> 6;
    uVar1 = bitStart >> 6;
    uVar2 = (ulong)uVar1;
    uVar5 = bitStart & 0x3f;
    if (uVar4 - uVar1 == 0) {
      uVar3 = ~(-1L << ((ulong)((bitEnd & 0x3f) - uVar5) & 0x3f)) << uVar5;
    }
    else {
      *(ulong *)(this + (ulong)uVar1 * 8) = *(ulong *)(this + (ulong)uVar1 * 8) | -1L << uVar5;
      if (uVar1 + 1 < uVar4) {
        memset(this + uVar2 * 8 + 8,0xff,(ulong)((uVar4 - uVar1) - 2) * 8 + 8);
      }
      if ((bitEnd & 0x3f) == 0) {
        return;
      }
      uVar2 = (ulong)uVar4;
      uVar3 = ~(-1L << (bitEnd & 0x3f));
    }
    *(ulong *)(this + uVar2 * 8) = *(ulong *)(this + uVar2 * 8) | uVar3;
  }
  return;
}

Assistant:

void SetRange(unsigned bitStart, unsigned bitEnd)
    {
        if (bitStart >= bitEnd) {
            return;
        }

        unsigned wordStart = bitStart / kWordBits;
        const unsigned wordEnd = bitEnd / kWordBits;

        bitStart %= kWordBits;

        if (wordEnd == wordStart)
        {
            // This implies x=(bitStart % kWordBits) and y=(bitEnd % kWordBits)
            // are in the same word.  Also: x < y, y < 64, y - x < 64.
            bitEnd %= kWordBits;
            WordT mask = ((WordT)1 << (bitEnd - bitStart)) - 1; // 1..63 bits
            mask <<= bitStart;
            Words[wordStart] |= mask;
            return;
        }

        // Set the end of the first word
        Words[wordStart] |= kAllOnes << bitStart;

        // Whole words at a time
        for (unsigned i = wordStart + 1; i < wordEnd; ++i) {
            Words[i] = kAllOnes;
        }

        // Set first few bits of the last word
        unsigned lastWordBits = bitEnd - wordEnd * kWordBits;
        if (lastWordBits > 0)
        {
            WordT mask = ((WordT)1 << lastWordBits) - 1; // 1..63 bits
            Words[wordEnd] |= mask;
        }
    }